

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

String * __thiscall asl::Socket_::readLine(String *__return_storage_ptr__,Socket_ *this)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  char c;
  
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
  uStack_28 = in_RAX;
  iVar1 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])(this);
  if ((iVar1 < 1) &&
     (iVar1 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xf])(0x404e000000000000,this),
     (char)iVar1 == '\0')) {
    return __return_storage_ptr__;
  }
  while( true ) {
    iVar1 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xd])(this,&c,1);
    if (iVar1 < 1) {
      return __return_storage_ptr__;
    }
    if (c == '\n') {
      return __return_storage_ptr__;
    }
    if (this->_error != 0) {
      return __return_storage_ptr__;
    }
    if (16000 < __return_storage_ptr__->_len) break;
    String::operator+=(__return_storage_ptr__,c);
  }
  this->_error = 4;
  String::operator=(__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

String Socket_::readLine()
{
	char c;
	String s;
	if (available()>0 || waitInput())
	{
		while (1)
		{
			int n = read(&c, 1);
			if (n <= 0 || c == '\n' || _error != 0)
				break;
			if (s.length() > 16000)
			{
				_error = SOCKET_BAD_LINE;
				s = "";
				break;
			}
			s += c;
		}
	}
	return s;
}